

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScParser.cpp
# Opt level: O0

char * matchName(char **data,char terminus)

{
  char *pcVar1;
  int iVar2;
  int local_2c;
  int nrAngles;
  char *start;
  char terminus_local;
  char **data_local;
  
  data_local = (char **)*data;
  local_2c = 0;
  while (**data != '\0') {
    iVar2 = isalnum((int)**data);
    if (((iVar2 == 0) && (**data != ':')) && (**data != '_')) {
      if (**data == '<') {
        local_2c = local_2c + 1;
      }
      else if ((**data == '>') && (0 < local_2c)) {
        local_2c = local_2c + -1;
      }
      else if (local_2c == 0) break;
    }
    *data = *data + 1;
  }
  if (**data == terminus) {
    if (**data != '\0') {
      pcVar1 = *data;
      *data = pcVar1 + 1;
      *pcVar1 = '\0';
    }
  }
  else {
    data_local = (char **)0x0;
  }
  return (char *)data_local;
}

Assistant:

inline char *matchName(char *&data, char terminus)
{
    char *start = data;

    for (int nrAngles = 0; *data; ++data) {
        if (isalnum(*data) || (*data == ':') || (*data == '_')) {
            continue;
        }
        if (*data == '<') {
            ++nrAngles;
            continue;
        }
        if ((*data == '>') && (nrAngles > 0)) {
            --nrAngles;
            continue;
        }
        if (nrAngles == 0) {
            break;
        }
    }

    if (*data != terminus) {
        return nullptr;
    }
    if (*data == '\0') {
        return start;
    }
    *(data++) = '\0';
    return start;
}